

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O3

void __thiscall
wasm::LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::
scanLivenessThroughActions
          (LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
           *this,vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions,
          SetOfLocals *live)

{
  int iVar1;
  Expression **ppEVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = (int)((long)((this->
                       super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                       ).
                       super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .
                       super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .
                       super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .stack.usedFixed -
                      (long)(this->
                            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                            ).
                            super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .
                            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .
                            super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .replacep) >> 3) * -0x55555555;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    uVar6 = uVar5 + 1;
    lVar3 = uVar5 * 0x18 + -0x14;
    do {
      ppEVar2 = (this->
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                ).
                super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .
                super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .
                super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .replacep;
      iVar1 = *(int *)((long)ppEVar2 + lVar3 + -4);
      if (iVar1 == 1) {
        SortedVector::erase((SortedVector *)actions,*(Index *)((long)ppEVar2 + lVar3));
      }
      else if (iVar1 == 0) {
        SortedVector::insert((SortedVector *)actions,*(Index *)((long)ppEVar2 + lVar3));
      }
      uVar6 = uVar6 - 1;
      lVar3 = lVar3 + -0x18;
    } while (1 < uVar6);
  }
  return;
}

Assistant:

void scanLivenessThroughActions(std::vector<LivenessAction>& actions,
                                  SetOfLocals& live) {
    // move towards the front
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      if (action.isGet()) {
        live.insert(action.index);
      } else if (action.isSet()) {
        live.erase(action.index);
      }
    }
  }